

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_info_fwd.hpp
# Opt level: O2

error_info * __thiscall
toml::
make_error_info<toml::source_location,char_const(&)[18],toml::source_location,char_const(&)[21]>
          (error_info *__return_storage_ptr__,toml *this,string *title,source_location *loc,
          string *msg,source_location *tail,char (*tail_1) [18],source_location *tail_2,
          char (*tail_3) [21])

{
  error_info ei;
  char (*in_stack_fffffffffffffda8) [21];
  allocator<char> local_249;
  undefined1 local_248 [32];
  string local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  error_info local_1c8;
  error_info local_170;
  source_location local_118;
  source_location local_a0;
  
  std::__cxx11::string::string
            (&local_1e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  source_location::source_location(&local_a0,(source_location *)title);
  std::__cxx11::string::string
            (&local_208,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)loc);
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_248 + 0x20),"",&local_249);
  error_info::error_info
            (&local_170,(string *)&local_1e8,&local_a0,(string *)&local_208,
             (string *)(local_248 + 0x20));
  std::__cxx11::string::~string((string *)(local_248 + 0x20));
  std::__cxx11::string::~string((string *)&local_208);
  source_location::~source_location(&local_a0);
  std::__cxx11::string::~string((string *)&local_1e8);
  error_info::error_info(&local_1c8,&local_170);
  source_location::source_location(&local_118,(source_location *)msg);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_248,&tail->is_ok_,&local_249);
  detail::make_error_info_rec<toml::source_location,char_const(&)[21]>
            (__return_storage_ptr__,(detail *)&local_1c8,(error_info *)&local_118,
             (source_location *)local_248,(string *)tail_1,tail_2,in_stack_fffffffffffffda8);
  std::__cxx11::string::~string((string *)local_248);
  source_location::~source_location(&local_118);
  error_info::~error_info(&local_1c8);
  error_info::~error_info(&local_170);
  return __return_storage_ptr__;
}

Assistant:

error_info make_error_info(
    std::string title, source_location loc, std::string msg, Ts&& ... tail)
{
    error_info ei(std::move(title), std::move(loc), std::move(msg));
    return detail::make_error_info_rec(ei, std::forward<Ts>(tail) ... );
}